

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (TabulationRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  pointer source;
  pointer args;
  int MT_local;
  int MF_local;
  int MAT_local;
  
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
            (&this->super_InterpolationBase,it,MAT,MF,MT);
  source = (this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->xValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)source >> 3;
  lVar4 = lVar1 / 3;
  lVar3 = lVar1 % 3;
  args = (this->yValues).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (4 < lVar1 + 2U) {
    do {
      tools::disco::
      Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
      ::
      write<std::back_insert_iterator<std::__cxx11::string>,double,double,double,double,double,double,int,int,int>
                (it,source,args,source + 1,args + 1,source + 2,args + 2,&MAT_local,&MF_local,
                 &MT_local);
      source = source + 3;
      args = args + 3;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
                (source[lVar4],it);
      tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
                (args[lVar4],it);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    if (lVar3 != 3) {
      lVar4 = lVar3 * -2 + 6;
      do {
        iVar2 = 0xb;
        do {
          std::__cxx11::string::push_back((char)it->container);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&MAT_local,&MF_local,&MT_local);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {
  record::InterpolationBase::print( it, MAT, MF, MT );

  using namespace njoy::tools;

  using Format = disco::Record< disco::ENDF, disco::ENDF,
                                disco::ENDF, disco::ENDF,
                                disco::ENDF, disco::ENDF,
                                disco::Integer< 4 >, disco::Integer< 2 >,
                                disco::Integer< 3 >, disco::Column< 5 > >;

  auto nFullLines = this->NP() / 3;
  auto partialLineEntries = this->NP() - nFullLines * 3;

  auto x = this->x().begin();
  auto y = this->y().begin();

  while ( nFullLines-- ){
    Format::write( it, x[0], y[0], x[1], y[1], x[2], y[2], MAT, MF, MT );
    x += 3; y += 3;
  }

  if ( partialLineEntries ){
    auto blankEntries = 2 * ( 3 - partialLineEntries );
    while ( partialLineEntries-- ){
      disco::ENDF::write( *x, it );
      disco::ENDF::write( *y, it );
      ++x; ++y;
    }

    while ( blankEntries-- ){ disco::Column< 11 >::write( it ); }

    using Format =
      disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                     disco::Integer< 3 >, disco::Column< 5 > >;

    Format::write( it, MAT, MF, MT );
  }
}